

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

SSTableDataEntry * __thiscall
DiskTableNode::getEntry(SSTableDataEntry *__return_storage_ptr__,DiskTableNode *this,longlong key)

{
  _Rb_tree<long_long,_std::pair<const_long_long,_unsigned_long>,_std::_Select1st<std::pair<const_long_long,_unsigned_long>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
  *this_00;
  iterator iVar1;
  longlong local_28;
  
  local_28 = key;
  this_00 = &getIndex(this)->_M_t;
  iVar1 = std::
          _Rb_tree<long_long,_std::pair<const_long_long,_unsigned_long>,_std::_Select1st<std::pair<const_long_long,_unsigned_long>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
          ::find(this_00,&local_28);
  if ((_Rb_tree_header *)iVar1._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
    SSTableDataEntry::SSTableDataEntry(__return_storage_ptr__,false,0,0,"");
  }
  else {
    SSTable::getEntry(__return_storage_ptr__,this->_sstable,(longlong)iVar1._M_node[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

SSTableDataEntry DiskTableNode::getEntry(long long key) {
    auto *i = getIndex();
    auto p = i->find(key);
    if (p == i->end()) {
        return SSTableDataEntry{false, 0, 0, ""};
    }
    auto offset = p->second;
    return _sstable->getEntry(offset);
}